

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_compute_branch_nm
               (DisasContext_conflict6 *ctx,uint32_t opc,int insn_bytes,int rs,int rt,int32_t offset
               )

{
  byte *pbVar1;
  target_ulong *ptVar2;
  TCGContext_conflict6 *s;
  bool bVar3;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGv_i64 arg2;
  TCGv_i64 pTVar4;
  uintptr_t o_6;
  TCGv_i64 ret;
  TCGOpcode TVar5;
  TCGCond cond;
  uintptr_t o_7;
  target_ulong tVar6;
  long lVar7;
  uint uVar8;
  
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a1 - (long)s);
  a1_00 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  arg2 = (TCGv_i64)((long)a1_00 - (long)s);
  if ((int)opc < 0x41c0000) {
    if (opc - 8 < 2) {
      if ((offset & 0xffffffefU) == 0) {
        pTVar4 = s->btarget;
        if (rs == 0) {
          tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)(pTVar4 + (long)s),0);
          bVar3 = false;
          tVar6 = 0xffffffffffffffff;
        }
        else {
          tVar6 = 0xffffffffffffffff;
          bVar3 = false;
          if (s->cpu_gpr[rs] != pTVar4) {
            tcg_gen_op2_mips64el
                      (s,INDEX_op_mov_i64,(TCGArg)(pTVar4 + (long)s),
                       (TCGArg)(s->cpu_gpr[rs] + (long)s));
            bVar3 = false;
          }
        }
        goto LAB_00995ccf;
      }
    }
    else if (opc == 0x4110000) {
      if (rs == 0) {
        bVar3 = false;
      }
      else {
        bVar3 = true;
        if (s->cpu_gpr[rs] != ret) {
          tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)a1,(TCGArg)(s->cpu_gpr[rs] + (long)s));
          bVar3 = true;
        }
      }
      lVar7 = (long)offset + (ulong)(uint)insn_bytes;
      goto LAB_00995cca;
    }
LAB_00995bfb:
    generate_exception_err(ctx,0x14,0);
  }
  else {
    if (opc == 0x41c0000) {
      tcg_gen_andi_i64_mips64el(s,ret,s->cpu_dspctrl,0x3f);
      tVar6 = (long)offset + (ulong)(uint)insn_bytes + (ctx->base).pc_next;
      bVar3 = true;
    }
    else {
      if ((opc != 0x14000000) && (opc != 0x10000000)) goto LAB_00995bfb;
      bVar3 = false;
      if (rs != rt) {
        if (rs == 0) {
          TVar5 = INDEX_op_movi_i64;
          pTVar4 = (TCGv_i64)0x0;
LAB_00995c6f:
          tcg_gen_op2_mips64el(s,TVar5,(TCGArg)a1,(TCGArg)pTVar4);
        }
        else if (s->cpu_gpr[rs] != ret) {
          pTVar4 = s->cpu_gpr[rs] + (long)s;
          TVar5 = INDEX_op_mov_i64;
          goto LAB_00995c6f;
        }
        if (rt == 0) {
          TVar5 = INDEX_op_movi_i64;
          pTVar4 = (TCGv_i64)0x0;
        }
        else {
          bVar3 = true;
          if (s->cpu_gpr[rt] == arg2) goto LAB_00995cb9;
          pTVar4 = s->cpu_gpr[rt] + (long)s;
          TVar5 = INDEX_op_mov_i64;
        }
        tcg_gen_op2_mips64el(s,TVar5,(TCGArg)a1_00,(TCGArg)pTVar4);
        bVar3 = true;
      }
LAB_00995cb9:
      lVar7 = (long)offset + (ulong)(uint)insn_bytes;
LAB_00995cca:
      tVar6 = lVar7 + (ctx->base).pc_next;
    }
LAB_00995ccf:
    if (bVar3) {
      if ((int)opc < 0x10000000) {
        if (opc == 0x4110000) {
          tcg_gen_setcondi_i64_mips64el(s,TCG_COND_GE,s->bcond,ret,0);
          tcg_gen_op2_mips64el
                    (s,INDEX_op_movi_i64,(TCGArg)(s->cpu_gpr[0x1f] + (long)s),
                     (ulong)(uint)insn_bytes + (ctx->base).pc_next);
        }
        else {
          if (opc != 0x41c0000) goto LAB_00995bfb;
          tcg_gen_setcondi_i64_mips64el(s,TCG_COND_GE,s->bcond,ret,0x20);
        }
        uVar8 = 0x1000;
      }
      else {
        if (opc == 0x14000000) {
          pTVar4 = s->bcond;
          cond = TCG_COND_NE;
        }
        else {
          if (opc != 0x10000000) goto LAB_00995bfb;
          pTVar4 = s->bcond;
          cond = TCG_COND_EQ;
        }
        tcg_gen_setcond_i64_mips64el(s,cond,pTVar4,ret,arg2);
        uVar8 = 0x1000;
      }
    }
    else if ((int)opc < 0x4110000) {
      if (opc == 8) {
        uVar8 = 0x2000;
      }
      else {
        if (opc != 9) goto LAB_00995bfb;
        uVar8 = 0x2000;
        if (0 < rt) {
          tcg_gen_op2_mips64el
                    (s,INDEX_op_movi_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_gpr[(uint)rt]),
                     (ulong)(uint)insn_bytes + (ctx->base).pc_next);
        }
      }
    }
    else {
      if (opc == 0x14000000) {
        tcg_gen_op2_mips64el
                  (s,INDEX_op_movi_i64,(TCGArg)(s->cpu_gpr[0x1f] + (long)s),(ctx->base).pc_next + 8)
        ;
        ptVar2 = &(ctx->base).pc_next;
        *ptVar2 = *ptVar2 + 4;
        goto LAB_00995e6f;
      }
      uVar8 = 0x800;
      if (opc != 0x10000000) {
        if (opc != 0x4110000) goto LAB_00995bfb;
        tcg_gen_op2_mips64el
                  (s,INDEX_op_movi_i64,(TCGArg)(s->cpu_gpr[0x1f] + (long)s),
                   (ulong)(uint)insn_bytes + (ctx->base).pc_next);
      }
    }
    ctx->hflags = ctx->hflags | uVar8;
    ctx->btarget = tVar6;
  }
LAB_00995e6f:
  if (insn_bytes == 2) {
    pbVar1 = (byte *)((long)&ctx->hflags + 1);
    *pbVar1 = *pbVar1 | 0x40;
  }
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(ret + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(arg2 + (long)s));
  return;
}

Assistant:

static void gen_compute_branch_nm(DisasContext *ctx, uint32_t opc,
                                int insn_bytes,
                                int rs, int rt, int32_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong btgt = -1;
    int bcond_compute = 0;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    /* Load needed operands */
    switch (opc) {
    case OPC_BEQ:
    case OPC_BNE:
        /* Compare two registers */
        if (rs != rt) {
            gen_load_gpr(tcg_ctx, t0, rs);
            gen_load_gpr(tcg_ctx, t1, rt);
            bcond_compute = 1;
        }
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_BGEZAL:
        /* Compare to zero */
        if (rs != 0) {
            gen_load_gpr(tcg_ctx, t0, rs);
            bcond_compute = 1;
        }
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_BPOSGE32:
        tcg_gen_andi_tl(tcg_ctx, t0, tcg_ctx->cpu_dspctrl, 0x3F);
        bcond_compute = 1;
        btgt = ctx->base.pc_next + insn_bytes + offset;
        break;
    case OPC_JR:
    case OPC_JALR:
        /* Jump to register */
        if (offset != 0 && offset != 16) {
            /*
             * Hint = 0 is JR/JALR, hint 16 is JR.HB/JALR.HB, the
             * others are reserved.
             */
            MIPS_INVAL("jump hint");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
        gen_load_gpr(tcg_ctx, tcg_ctx->btarget, rs);
        break;
    default:
        MIPS_INVAL("branch/jump");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
    if (bcond_compute == 0) {
        /* No condition to be computed */
        switch (opc) {
        case OPC_BEQ:     /* rx == rx        */
            /* Always take */
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BGEZAL:  /* 0 >= 0          */
            /* Always take and link */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31],
                            ctx->base.pc_next + insn_bytes);
            ctx->hflags |= MIPS_HFLAG_B;
            break;
        case OPC_BNE:     /* rx != rx        */
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31], ctx->base.pc_next + 8);
            /* Skip the instruction in the delay slot */
            ctx->base.pc_next += 4;
            goto out;
        case OPC_JR:
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        case OPC_JALR:
            if (rt > 0) {
                tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt],
                                ctx->base.pc_next + insn_bytes);
            }
            ctx->hflags |= MIPS_HFLAG_BR;
            break;
        default:
            MIPS_INVAL("branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
    } else {
        switch (opc) {
        case OPC_BEQ:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->bcond, t0, t1);
            goto not_likely;
        case OPC_BNE:
            tcg_gen_setcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->bcond, t0, t1);
            goto not_likely;
        case OPC_BGEZAL:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 0);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[31],
                            ctx->base.pc_next + insn_bytes);
            goto not_likely;
        case OPC_BPOSGE32:
            tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_GE, tcg_ctx->bcond, t0, 32);
        not_likely:
            ctx->hflags |= MIPS_HFLAG_BC;
            break;
        default:
            MIPS_INVAL("conditional branch/jump");
            generate_exception_end(ctx, EXCP_RI);
            goto out;
        }
    }

    ctx->btarget = btgt;

 out:
    if (insn_bytes == 2) {
        ctx->hflags |= MIPS_HFLAG_B16;
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}